

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O0

double __thiscall w3Module::read_f64(w3Module *this,uint8_t **cursor)

{
  uint8_t uVar1;
  uint local_24;
  double dStack_20;
  uint32_t i;
  anon_union_8_2_095b82ba u;
  uint8_t **cursor_local;
  w3Module *this_local;
  
  u = (anon_union_8_2_095b82ba)cursor;
  cursor_local = (uint8_t **)this;
  for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
    uVar1 = read_byte(this,(uint8_t **)u);
    *(uint8_t *)((long)&stack0xffffffffffffffe0 + (ulong)local_24) = uVar1;
  }
  return dStack_20;
}

Assistant:

double w3Module::read_f64 (uint8_t** cursor)
// floats are not variably sized? Spec is unclear due to fancy notation
// getting in the way.
{
    union
    {
        uint8_t bytes [8];
        double f64;
    } u;
    for (uint32_t i = 0; i < 8; ++i)
        u.bytes [i] = (uint8_t)read_byte (cursor);
    return u.f64;
}